

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg3C
          (ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,uint cacheId)

{
  code *pcVar1;
  uint cacheId_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot R2_00;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  RegSlot local_4c;
  RegSlot local_48;
  RegSlot local_44;
  CacheId local_40;
  uint local_3c;
  uint local_38;
  RegSlot local_34;
  
  local_38 = cacheId;
  local_34 = R2;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0xf);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1de,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089b304;
    *puVar3 = 0;
  }
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089b304;
      *puVar3 = 0;
    }
    R0_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0089b304;
        *puVar3 = 0;
      }
      cacheId_00 = local_38;
      local_3c = (uint)CONCAT62(in_register_00000032,op);
      R1_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R1);
      if (local_34 != 0xffffffff) {
        if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_0089b221:
          R2_00 = FunctionBody::MapRegSlot(this->m_functionWrite,local_34);
          local_34 = local_3c & 0xffff;
          bVar2 = TryWriteReg3C<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                            (this,(OpCode)local_3c,R0_00,R1_00,R2_00,cacheId_00);
          if (!bVar2) {
            bVar2 = TryWriteReg3C<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,(OpCode)local_34,R0_00,R1_00,R2_00,cacheId_00);
            if (!bVar2) {
              local_40 = cacheId_00;
              local_4c = R0_00;
              local_48 = R1_00;
              local_44 = R2_00;
              Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
              Data::Write(&this->m_byteCodeData,&local_4c,0x10);
            }
          }
          return;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (bVar2) {
          *puVar3 = 0;
          goto LAB_0089b221;
        }
        goto LAB_0089b304;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089b304:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg3C(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, uint cacheId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3C);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        MULTISIZE_LAYOUT_WRITE(Reg3C, op, R0, R1, R2, cacheId);
    }